

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O2

void __thiscall xray_re::se_level_changer::se_level_changer(se_level_changer *this)

{
  allocator<char> local_11;
  
  cse_alife_level_changer::cse_alife_level_changer(&this->super_cse_alife_level_changer);
  (this->super_cse_alife_level_changer).super_cse_alife_space_restrictor.
  super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__se_level_changer_0023c918;
  (this->super_cse_alife_level_changer).super_cse_alife_space_restrictor.super_cse_shape.
  _vptr_cse_shape = (_func_int **)&PTR__se_level_changer_0023c980;
  (this->super_cse_alife_level_changer).field_0x199 = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_hint,"level_changer_invitation",&local_11);
  return;
}

Assistant:

se_level_changer::se_level_changer():
	m_enabled(true), m_hint("level_changer_invitation") {}